

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O1

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantOuterTriangleSetTestInstance::
genTessLevelCases(vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                  *__return_storage_ptr__,InvariantOuterTriangleSetTestInstance *this)

{
  TessPrimitiveType TVar1;
  pointer pTVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  int subCaseNdx;
  int iVar6;
  int i;
  ulong uVar7;
  float fVar8;
  LevelCase levelCase;
  TessLevels levels;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  baseResult;
  Random rnd;
  value_type local_a8;
  TessLevels local_88;
  pointer local_70;
  ulong local_68;
  ulong local_60;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  local_58;
  deRandom local_40;
  
  TVar1 = (this->super_InvarianceTestInstance).m_caseDef.primitiveType;
  uVar3 = 3;
  if (TVar1 != TESSPRIMITIVETYPE_TRIANGLES) {
    uVar3 = (uint)(TVar1 == TESSPRIMITIVETYPE_QUADS) << 2;
  }
  InvarianceTestInstance::genTessLevelCases(&local_58,&this->super_InvarianceTestInstance);
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deRandom_init(&local_40,0x7b);
  local_70 = local_58.
             super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
             ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (uint)((ulong)((long)local_58.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_58.
                              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5);
  if (0 < (int)uVar4) {
    local_60 = (ulong)uVar3;
    uVar5 = 0;
    do {
      pTVar2 = local_70[uVar5].levels.
               super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68 = uVar5;
      if (((pTVar2->inner[0] != 1.0) || (NAN(pTVar2->inner[0]))) &&
         ((pTVar2->inner[1] != 1.0 ||
          (this->super_InvarianceTestInstance).m_caseDef.primitiveType != TESSPRIMITIVETYPE_QUADS)
          && uVar3 != 0)) {
        uVar5 = 0;
        do {
          local_88.outer._8_8_ = *(undefined8 *)(pTVar2->outer + 2);
          local_88.inner = *&pTVar2->inner;
          local_88.outer._0_8_ = *(undefined8 *)pTVar2->outer;
          local_a8.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          local_a8.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          local_a8.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_a8.levels.
          super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
          ._M_impl.super__Vector_impl_data._M_finish = (TessLevels *)0x0;
          local_a8.mem = (int)uVar5;
          iVar6 = 0;
          do {
            if (local_a8.levels.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                (TessLevels *)
                CONCAT44(local_a8.levels.
                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         local_a8.levels.
                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_)) {
              std::
              vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>::
              _M_realloc_insert<vkt::tessellation::TessLevels_const&>
                        ((vector<vkt::tessellation::TessLevels,std::allocator<vkt::tessellation::TessLevels>>
                          *)&local_a8,
                         (iterator)
                         local_a8.levels.
                         super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_88);
            }
            else {
              *(undefined8 *)
               ((local_a8.levels.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->outer + 2) = local_88.outer._8_8_;
              *&(local_a8.levels.
                 super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->inner = local_88.inner;
              *(undefined8 *)
               (local_a8.levels.
                super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                ._M_impl.super__Vector_impl_data._M_finish)->outer = local_88.outer._0_8_;
              local_a8.levels.
              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_a8.levels.
                   super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar7 = 0;
            do {
              if (uVar5 != uVar7) {
                fVar8 = deRandom_getFloat(&local_40);
                *(float *)((long)&local_88 + (uVar7 - 2) * 4 + 0x10) = fVar8 * 14.0 + 2.0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 != 4);
            if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType ==
                TESSPRIMITIVETYPE_TRIANGLES) {
              fVar8 = deRandom_getFloat(&local_40);
              local_88.inner[1] = fVar8 * 14.0 + 2.0;
            }
            iVar6 = iVar6 + 1;
          } while (iVar6 != 4);
          std::
          vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
          ::push_back(__return_storage_ptr__,&local_a8);
          if (local_a8.levels.
              super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a8.levels.
                            super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT44(local_a8.levels.
                                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                     local_a8.levels.
                                     super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                            (long)local_a8.levels.
                                  super__Vector_base<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != local_60);
      }
      uVar5 = local_68 + 1;
    } while (uVar5 != (uVar4 & 0x7fffffff));
  }
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> genTessLevelCases (void) const
	{
		const int						numSubCasesPerEdge	= 4;
		const int						numEdges			= m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES	? 3
															: m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS		? 4 : 0;
		const std::vector<LevelCase>	baseResult			= InvarianceTestInstance::genTessLevelCases();
		std::vector<LevelCase>			result;
		de::Random						rnd					(123);

		// Generate variants with different values for irrelevant levels.
		for (int baseNdx = 0; baseNdx < static_cast<int>(baseResult.size()); ++baseNdx)
		{
			const TessLevels& base = baseResult[baseNdx].levels[0];
			if (base.inner[0] == 1.0f || (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS && base.inner[1] == 1.0f))
				continue;

			for (int edgeNdx = 0; edgeNdx < numEdges; ++edgeNdx)
			{
				TessLevels	levels = base;
				LevelCase	levelCase;
				levelCase.mem = edgeNdx;

				for (int subCaseNdx = 0; subCaseNdx < numSubCasesPerEdge; ++subCaseNdx)
				{
					levelCase.levels.push_back(levels);

					for (int i = 0; i < DE_LENGTH_OF_ARRAY(levels.outer); ++i)
					{
						if (i != edgeNdx)
							levels.outer[i] = rnd.getFloat(2.0f, 16.0f);
					}

					if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
						levels.inner[1] = rnd.getFloat(2.0f, 16.0f);
				}

				result.push_back(levelCase);
			}
		}

		return result;
	}